

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O1

int event_base_gettimeofday_cached(event_base *base,timeval *tv)

{
  int iVar1;
  long lVar2;
  long lVar3;
  
  if ((base == (event_base *)0x0) &&
     (base = event_global_current_base_, event_global_current_base_ == (event_base *)0x0)) {
    iVar1 = gettimeofday((timeval *)tv,(__timezone_ptr_t)0x0);
    return iVar1;
  }
  if (base->th_base_lock != (void *)0x0) {
    (*evthread_lock_fns_.lock)(0,base->th_base_lock);
  }
  lVar2 = (base->tv_cache).tv_sec;
  if (lVar2 == 0) {
    iVar1 = gettimeofday((timeval *)tv,(__timezone_ptr_t)0x0);
  }
  else {
    lVar2 = lVar2 + (base->tv_clock_diff).tv_sec;
    tv->tv_sec = lVar2;
    lVar3 = (base->tv_clock_diff).tv_usec + (base->tv_cache).tv_usec;
    tv->tv_usec = lVar3;
    iVar1 = 0;
    if (999999 < lVar3) {
      tv->tv_sec = lVar2 + 1;
      tv->tv_usec = lVar3 + -1000000;
      iVar1 = 0;
    }
  }
  if (base->th_base_lock != (void *)0x0) {
    (*evthread_lock_fns_.unlock)(0,base->th_base_lock);
  }
  return iVar1;
}

Assistant:

int
event_base_gettimeofday_cached(struct event_base *base, struct timeval *tv)
{
	int r;
	if (!base) {
		base = current_base;
		if (!current_base)
			return evutil_gettimeofday(tv, NULL);
	}

	EVBASE_ACQUIRE_LOCK(base, th_base_lock);
	if (base->tv_cache.tv_sec == 0) {
		r = evutil_gettimeofday(tv, NULL);
	} else {
		evutil_timeradd(&base->tv_cache, &base->tv_clock_diff, tv);
		r = 0;
	}
	EVBASE_RELEASE_LOCK(base, th_base_lock);
	return r;
}